

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::JsonReporter::JsonReporter(JsonReporter *this,ReporterConfig *config)

{
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t __n;
  void *__buf;
  int iVar1;
  _Elt_pointer pJVar2;
  JsonObjectWriter metadata_writer;
  uint local_1c4;
  JsonValueWriter local_1c0;
  
  StreamingReporterBase::StreamingReporterBase(&this->super_StreamingReporterBase,config);
  (this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener._vptr_IEventListener =
       (_func_int **)&PTR__JsonReporter_001a4bd8;
  (this->m_testCaseTimer).m_nanoseconds = 0;
  std::
  stack<Catch::JsonObjectWriter,std::deque<Catch::JsonObjectWriter,std::allocator<Catch::JsonObjectWriter>>>
  ::stack<std::deque<Catch::JsonObjectWriter,std::allocator<Catch::JsonObjectWriter>>,void>
            (&this->m_objectWriters);
  std::
  stack<Catch::JsonArrayWriter,std::deque<Catch::JsonArrayWriter,std::allocator<Catch::JsonArrayWriter>>>
  ::stack<std::deque<Catch::JsonArrayWriter,std::allocator<Catch::JsonArrayWriter>>,void>
            (&this->m_arrayWriters);
  std::
  stack<Catch::JsonReporter::Writer,std::deque<Catch::JsonReporter::Writer,std::allocator<Catch::JsonReporter::Writer>>>
  ::stack<std::deque<Catch::JsonReporter::Writer,std::allocator<Catch::JsonReporter::Writer>>,void>
            (&this->m_writers);
  this->m_startedListing = false;
  (this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_preferences.
  shouldRedirectStdOut = true;
  (this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_preferences.
  shouldReportAllAssertions = true;
  std::deque<Catch::JsonObjectWriter,std::allocator<Catch::JsonObjectWriter>>::
  emplace_back<std::ostream&>
            ((deque<Catch::JsonObjectWriter,std::allocator<Catch::JsonObjectWriter>> *)
             &this->m_objectWriters,(this->super_StreamingReporterBase).super_ReporterBase.m_stream)
  ;
  local_1c0.m_os._0_4_ = 0;
  std::deque<Catch::JsonReporter::Writer,_std::allocator<Catch::JsonReporter::Writer>_>::
  emplace_back<Catch::JsonReporter::Writer>(&(this->m_writers).c,(Writer *)&local_1c0);
  pJVar2 = (this->m_objectWriters).c.
           super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pJVar2 == (this->m_objectWriters).c.
                super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pJVar2 = (this->m_objectWriters).c.
             super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  iVar1 = (int)pJVar2 + -0x18;
  JsonObjectWriter::write((JsonObjectWriter *)&local_1c0,iVar1,"version",7);
  metadata_writer.m_os._0_4_ = 1;
  JsonValueWriter::write<int>(&local_1c0,(int *)&metadata_writer);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1c0.m_sstream);
  JsonObjectWriter::write((JsonObjectWriter *)&local_1c0,iVar1,"metadata",8);
  JsonValueWriter::writeObject(&metadata_writer,&local_1c0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1c0.m_sstream);
  __n = 4;
  JsonObjectWriter::write((JsonObjectWriter *)&local_1c0,(int)&metadata_writer,"name",4);
  iVar1 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[3])();
  JsonValueWriter::write(&local_1c0,iVar1,__buf,__n);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1c0.m_sstream);
  JsonObjectWriter::write((JsonObjectWriter *)&local_1c0,(int)&metadata_writer,"rng-seed",8);
  local_1c4 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.
                m_config)->_vptr_IConfig[0x11])();
  JsonValueWriter::write<unsigned_int>(&local_1c0,&local_1c4);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1c0.m_sstream);
  JsonObjectWriter::write((JsonObjectWriter *)&local_1c0,(int)&metadata_writer,"catch2-version",0xe)
  ;
  libraryVersion();
  JsonValueWriter::write<Catch::Version>(&local_1c0,&libraryVersion::version);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1c0.m_sstream);
  iVar1 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[0xd])();
  if (*(long *)CONCAT44(extraout_var,iVar1) != ((long *)CONCAT44(extraout_var,iVar1))[1]) {
    JsonObjectWriter::write((JsonObjectWriter *)&local_1c0,(int)&metadata_writer,"filters",7);
    iVar1 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)
              ->_vptr_IConfig[0xd])();
    JsonValueWriter::write<Catch::TestSpec>(&local_1c0,(TestSpec *)CONCAT44(extraout_var_00,iVar1));
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1c0.m_sstream);
  }
  JsonObjectWriter::~JsonObjectWriter(&metadata_writer);
  return;
}

Assistant:

JsonReporter::JsonReporter( ReporterConfig&& config ):
        StreamingReporterBase{ CATCH_MOVE( config ) } {

        m_preferences.shouldRedirectStdOut = true;
        // TBD: Do we want to report all assertions? XML reporter does
        //      not, but for machine-parseable reporters I think the answer
        //      should be yes.
        m_preferences.shouldReportAllAssertions = true;

        m_objectWriters.emplace( m_stream );
        m_writers.emplace( Writer::Object );
        auto& writer = m_objectWriters.top();

        writer.write( "version"_sr ).write( 1 );

        {
            auto metadata_writer = writer.write( "metadata"_sr ).writeObject();
            metadata_writer.write( "name"_sr ).write( m_config->name() );
            metadata_writer.write( "rng-seed"_sr ).write( m_config->rngSeed() );
            metadata_writer.write( "catch2-version"_sr )
                .write( libraryVersion() );
            if ( m_config->testSpec().hasFilters() ) {
                metadata_writer.write( "filters"_sr )
                    .write( m_config->testSpec() );
            }
        }
    }